

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar8;
  uint uVar9;
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  seconds another_ten_years;
  duration<31536000UL> one_year_and_quarter;
  years half_year;
  years ten_years;
  char data [256];
  datetime r;
  double local_1b8 [3];
  char *local_1a0;
  long local_198;
  char local_190 [16];
  undefined8 local_180;
  char *local_178;
  undefined8 local_170;
  char local_168 [16];
  undefined1 local_158 [32];
  undefined8 local_138;
  long lStack_130;
  char *local_128;
  tm local_58;
  
  setlocale(6,"");
  local_180 = 0x4024000000000000;
  local_1b8[2] = 0.5;
  local_1b8[1] = 1.2465753424657535;
  local_58._0_8_ = time((time_t *)0x0);
  local_158._0_8_ = (pointer)0x0;
  local_158._8_8_ = 0;
  local_158._16_8_ = 0;
  local_158._24_4_ = 0;
  local_158._28_4_ = 0;
  local_138._0_4_ = 0;
  local_138._4_4_ = 0;
  lStack_130 = 0;
  local_128 = (char *)0x0;
  localtime_r((time_t *)&local_58,(tm *)local_158);
  local_58.tm_wday = local_158._24_4_;
  local_58.tm_yday = local_158._28_4_;
  local_58.tm_sec = local_158._0_4_;
  local_58.tm_min = local_158._4_4_;
  local_58.tm_hour = local_158._8_4_;
  local_58.tm_mday = local_158._12_4_;
  local_58.tm_isdst = (int)local_138;
  local_58._36_4_ = local_138._4_4_;
  local_58.tm_gmtoff = lStack_130;
  local_58.tm_zone = local_128;
  local_58.tm_year = SUB84(local_158._16_8_,4);
  local_58.tm_year = local_58.tm_year + 10;
  local_58.tm_mon = (int)local_158._16_8_;
  mktime(&local_58);
  local_1a0 = (char *)time((time_t *)0x0);
  local_158._0_8_ = (char *)0x0;
  local_158._8_8_ = 0;
  local_158._16_8_ = 0;
  local_158._24_4_ = 0;
  local_158._28_4_ = 0;
  local_138._0_4_ = 0;
  local_138._4_4_ = 0;
  lStack_130 = 0;
  local_128 = (char *)0x0;
  localtime_r((time_t *)&local_1a0,(tm *)local_158);
  uVar6 = local_58.tm_hour - local_158._8_4_;
  iVar8 = local_58.tm_mday - local_158._12_4_;
  uVar9 = local_58.tm_mon - local_158._16_4_;
  auVar7._12_4_ = local_58.tm_year - local_158._20_4_;
  auVar4._4_4_ = iVar8;
  auVar4._0_4_ = uVar6;
  auVar4._8_4_ = iVar8;
  auVar4._12_4_ = auVar7._12_4_;
  auVar7._4_4_ = auVar7._12_4_;
  auVar7._0_4_ = uVar9;
  auVar7._8_4_ = auVar7._12_4_;
  auVar11._0_4_ = -(uint)((int)uVar9 < 0);
  auVar11._4_4_ = -(uint)(auVar7._12_4_ < 0);
  auVar11._8_4_ = -(uint)(auVar7._12_4_ < 0);
  auVar11._12_4_ = -(uint)(auVar7._12_4_ < 0);
  auVar10._0_4_ = -(uint)((int)uVar6 < 0);
  auVar10._4_4_ = -(uint)(iVar8 < 0);
  auVar10._8_4_ = -(uint)(iVar8 < 0);
  auVar10._12_4_ = -(uint)(auVar7._12_4_ < 0);
  lVar2 = ((auVar10._8_8_ & 0xffffffff) * 0x15180 << 0x20) + (auVar4._8_8_ & 0xffffffff) * 0x15180 +
          ((auVar11._8_8_ & 0xffffffff) * 0x1e13380 << 0x20) +
          (auVar7._8_8_ & 0xffffffff) * 0x1e13380 +
          ((ulong)auVar10._0_4_ * 0xe10 << 0x20) + (ulong)uVar6 * 0xe10 +
          ((ulong)auVar11._0_4_ * 0x278d00 << 0x20) + (ulong)uVar9 * 0x278d00 +
          ((long)local_58.tm_sec - (long)(int)local_158._0_4_) +
          ((long)local_58.tm_min - (long)(int)local_158._4_4_) * 0x3c;
  auVar5._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar5._0_8_ = lVar2;
  auVar5._12_4_ = 0x45300000;
  local_1b8[0] = (auVar5._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ten_years            ->   ",0x1a);
  asap::duration<31536000ul>::str_abi_cxx11_((string *)local_158,&local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
  pcVar1 = local_158 + 0x10;
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"one_year_and_quarter ->   ",0x1a);
  asap::duration<31536000ul>::str_abi_cxx11_((string *)local_158,local_1b8 + 1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"ten_years_from_now   ->   ",0x1a);
  builtin_strncpy(local_168,"%x %X",6);
  local_170 = 5;
  local_178 = local_168;
  strftime(local_158,0x100,local_168,&local_58);
  local_1a0 = local_190;
  sVar3 = strlen(local_158);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,local_158,local_158 + sVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1a0,local_198);
  if (local_1a0 != local_190) {
    operator_delete(local_1a0);
  }
  if (local_178 != local_168) {
    operator_delete(local_178);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"another_ten_years    ->   ",0x1a);
  asap::duration<1ul>::str_abi_cxx11_((string *)local_158,local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"half_year            ->   ",0x1a);
  asap::duration<31536000ul>::str_abi_cxx11_((string *)local_158,local_1b8 + 2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_158._0_8_,local_158._8_8_);
  if ((char *)local_158._0_8_ != pcVar1) {
    operator_delete((void *)local_158._0_8_);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
  std::ostream::put(-0x78);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* duration types represent durations in various granularities, from seconds to days. */
  auto ten_years = asap::years(10);

  /* you can specify a fraction of a duration: */
  auto half_year = asap::years(0.5f);

  /* you can sum and subtract durations. be aware that the right operand will be converted to the first operand
   * granularity (i.e, when adding years + days, days will be converted to a fraction of a year) */
  auto one_year_and_quarter = asap::years(1) + asap::months(3);

  /* you can add or subtract a duration from a datetime */
  auto ten_years_from_now = asap::now() + ten_years;

  /* subtracting two datetimes yields a duration, in seconds */
  auto another_ten_years = ten_years_from_now - asap::now();

  std::cout << "ten_years            ->   " << ten_years << std::endl;
  std::cout << "one_year_and_quarter ->   " << one_year_and_quarter << std::endl;
  std::cout << "ten_years_from_now   ->   " << ten_years_from_now << std::endl;
  std::cout << "another_ten_years    ->   " << another_ten_years << std::endl;

  /* be aware that for printing and arithmethics, a month has 30 days, thus half an year
   * is actually 6 months, 2 days and 12 hours. asap::years(0.5) != asap::months(6) */
  std::cout << "half_year            ->   " << half_year << std::endl;

  return 0;
}